

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O1

void __thiscall duckdb::RleBpDecoder::Skip(RleBpDecoder *this,uint32_t batch_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (batch_size != 0) {
    uVar3 = 0;
    do {
      uVar1 = this->repeat_count_;
      if (uVar1 == 0) {
        uVar1 = this->literal_count_;
        if (uVar1 == 0) {
          NextCounts(this);
        }
        else {
          uVar2 = batch_size - uVar3;
          if (uVar1 <= batch_size - uVar3) {
            uVar2 = uVar1;
          }
          ParquetDecodeUtils::Skip
                    (&this->buffer_,&this->bitpack_pos,(ulong)uVar2,
                     (bitpacking_width_t)this->bit_width_);
          this->literal_count_ = this->literal_count_ - uVar2;
          uVar3 = uVar2 + uVar3;
        }
      }
      else {
        uVar2 = batch_size - uVar3;
        if (uVar1 <= batch_size - uVar3) {
          uVar2 = uVar1;
        }
        this->repeat_count_ = uVar1 - uVar2;
        uVar3 = uVar3 + uVar2;
      }
    } while (uVar3 < batch_size);
  }
  return;
}

Assistant:

void Skip(uint32_t batch_size) {
		uint32_t values_skipped = 0;

		while (values_skipped < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_skipped, repeat_count_);
				repeat_count_ -= repeat_batch;
				values_skipped += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_skipped, literal_count_);
				ParquetDecodeUtils::Skip(buffer_, bitpack_pos, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_skipped += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_skipped == batch_size);
	}